

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::EmitLoadConstFloat
          (CodegenVisitor *this,SQFloat value,SQInteger target)

{
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_10;
  undefined1 local_c;
  undefined1 local_b;
  undefined2 local_a;
  
  if (target < 0) {
    target = SQFuncState::PushTarget(this->_fs,-1);
  }
  local_c = 3;
  local_b = (undefined1)target;
  local_a = 0;
  local_10 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)value;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_10);
  return;
}

Assistant:

void CodegenVisitor::EmitLoadConstFloat(SQFloat value, SQInteger target)
{
    if (target < 0) {
        target = _fs->PushTarget();
    }
    if (sizeof(SQFloat) == sizeof(SQInt32)) {
        _fs->AddInstruction(_OP_LOADFLOAT, target, *((SQInt32 *)&value));
    }
    else {
        _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
    }
}